

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O2

int fminnewt(custom_function *funcpt,custom_gradient *funcgrad,int N,double *xi,double delta,
            double *dx,double fsval,double maxstep,int method,double *xf)

{
  int iVar1;
  int iVar2;
  double __x;
  double dVar3;
  double stol;
  int local_34 [2];
  int niter;
  
  iVar2 = N * 200;
  local_34[0] = 0;
  __x = macheps();
  if (method == 3) {
    dVar3 = pow(__x,0.3333333333333333);
    stol = dVar3 * dVar3;
    iVar1 = 1000;
    if (1000 < iVar2) {
      iVar1 = iVar2;
    }
    iVar2 = 1;
  }
  else {
    if (method != 2) {
      if (method == 1) {
        dVar3 = pow(__x,0.3333333333333333);
        iVar1 = 1000;
        if (1000 < iVar2) {
          iVar1 = iVar2;
        }
        iVar2 = newton_min_func(funcpt,funcgrad,xi,N,dx,fsval,maxstep,iVar1,local_34,__x,dVar3,
                                dVar3 * dVar3,xf);
        return iVar2;
      }
      puts("Method Value should be one of 1,2 or 3. See Documentation. ");
      exit(1);
    }
    dVar3 = pow(__x,0.3333333333333333);
    stol = dVar3 * dVar3;
    iVar1 = 1000;
    if (1000 < iVar2) {
      iVar1 = iVar2;
    }
    iVar2 = 0;
  }
  iVar2 = newton_min_trust(funcpt,funcgrad,xi,N,dx,fsval,delta,iVar2,iVar1,local_34,__x,dVar3,stol,
                           xf);
  return iVar2;
}

Assistant:

int fminnewt(custom_function *funcpt, custom_gradient *funcgrad, int N, double *xi,
	     double delta,double *dx,double fsval,double maxstep, int method,double *xf) {
	int retval;
	int MAXITER,niter;
	double eps,gtol,stol;
	/*

	 * Method 1 - Newton Line Search
	 * Method 2 - Newton Trust Region - Hook Step
	 * Method 3 - Newton Trust Region - Double Dog-Leg
	 *
	 * Default Values :
	 *
	 * fsval = 1.0
	 * delta = -1.0
	 * dx = {1.0,1.0,...} - 1XN vector

	 */
	/*
	 * Return Codes
	 *
	 * Code 1 denotes probable success.
	 * Codes 2,3 and 6 denote possible success.
	 * Codes 0, 4 and 15 denote failure. [Code 4 my also occur in cases where the minima is realized but
	 * convergence is not achieved due to tolerance values being too small. It is recommended that you use
	 * another method if you suspect that such a scenario has occured.]
	 *
	 * 0 - Input Error
	 * 1 - df(x)/dx <= gtol achieved so current point may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so the point may be the local minima.
	 * 3 - Global Step failed to locate a lower point than the current point so it may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence probably not achieved.
	 * 6 - Function value drops below ftol (relative functional tolerance).
	 * 15 - Overflow occurs. Try a different method.
	 *
	 */

	MAXITER = 200*N;
	niter = 0;

	eps = macheps(); // Use macheps program

	if (method == 1) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_func(funcpt,funcgrad,xi,N,dx,fsval,maxstep,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 2) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_trust(funcpt,funcgrad,xi,N,dx,fsval,delta,0,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 3) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_trust(funcpt,funcgrad,xi,N,dx,fsval,delta,1,MAXITER,&niter,eps,gtol,stol,xf);
	} else {
		printf("Method Value should be one of 1,2 or 3. See Documentation. \n");
		exit(1);
	}


	return retval;
}